

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O2

Id dxil_spv::build_ssbo_load_array
             (Builder *builder,Id value_type,Id ssbo_id,uint32_t member,Id offset)

{
  _Head_base<0UL,_spv::Instruction_*,_false> this;
  Id IVar1;
  _Head_base<0UL,_spv::Instruction_*,_false> local_60;
  uint local_58;
  Id value_type_local;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  undefined4 local_38;
  Id ptr_id;
  
  value_type_local = value_type;
  ptr_id = spv::Builder::makePointer(builder,StorageClassStorageBuffer,value_type);
  local_60._M_head_impl._0_4_ = builder->uniqueId + 1;
  builder->uniqueId = (Id)local_60._M_head_impl;
  local_58 = 0x41;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_40,(uint *)&local_60,&ptr_id);
  spv::Instruction::addIdOperand(local_40._M_head_impl,ssbo_id);
  this._M_head_impl = local_40._M_head_impl;
  IVar1 = spv::Builder::makeUintConstant(builder,member,false);
  spv::Instruction::addIdOperand(this._M_head_impl,IVar1);
  spv::Instruction::addIdOperand(local_40._M_head_impl,offset);
  local_58 = builder->uniqueId + 1;
  builder->uniqueId = local_58;
  local_38 = 0x3d;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_60,&local_58,&value_type_local);
  spv::Instruction::addIdOperand(local_60._M_head_impl,(local_40._M_head_impl)->resultId);
  IVar1 = (local_60._M_head_impl)->resultId;
  local_48._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (builder->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
  if (local_48._M_head_impl != (Instruction *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Instruction[1])();
  }
  local_48._M_head_impl = (Instruction *)0x0;
  local_50._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl = (Instruction *)0x0;
  spv::Block::addInstruction
            (builder->buildPoint,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Instruction[1])();
  }
  local_50._M_head_impl = (Instruction *)0x0;
  if (local_60._M_head_impl != (Instruction *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Instruction[1])();
  }
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  return IVar1;
}

Assistant:

static spv::Id build_ssbo_load_array(spv::Builder &builder, spv::Id value_type, spv::Id ssbo_id, uint32_t member,
                                     spv::Id offset)
{
	spv::Id ptr_id = builder.makePointer(spv::StorageClassStorageBuffer, value_type);
	auto chain = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_id, spv::OpAccessChain);
	chain->addIdOperand(ssbo_id);
	chain->addIdOperand(builder.makeUintConstant(member));
	chain->addIdOperand(offset);

	auto load = std::make_unique<spv::Instruction>(builder.getUniqueId(), value_type, spv::OpLoad);
	load->addIdOperand(chain->getResultId());
	spv::Id result_id = load->getResultId();

	builder.getBuildPoint()->addInstruction(std::move(chain));
	builder.getBuildPoint()->addInstruction(std::move(load));
	return result_id;
}